

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsim.cpp
# Opt level: O3

void setup_states(void)

{
  Btor2Line *l;
  Btor2Sort *pBVar1;
  long lVar2;
  long lVar3;
  
  std::vector<BtorSimState,_std::allocator<BtorSimState>_>::resize(&current_state,num_format_lines);
  std::vector<BtorSimState,_std::allocator<BtorSimState>_>::resize(&next_state,num_format_lines);
  if (dump_vcd == '\x01') {
    std::vector<BtorSimState,_std::allocator<BtorSimState>_>::resize
              (&vcd_writer->prev_value,num_format_lines);
  }
  if (0 < num_format_lines) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      l = (Btor2Line *)btor2parser_get_line_by_id(model,lVar3);
      if (l != (Btor2Line *)0x0) {
        pBVar1 = get_sort(l,model);
        if (pBVar1->tag == BTOR2_TAG_SORT_array) {
          *(undefined4 *)
           ((long)&(current_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                    _M_impl.super__Vector_impl_data._M_start)->type + lVar2) = 2;
          *(undefined4 *)
           ((long)&(next_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                    _M_impl.super__Vector_impl_data._M_start)->type + lVar2) = 2;
          if (dump_vcd == '\x01') {
            *(undefined4 *)
             ((long)&((vcd_writer->prev_value).
                      super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
                      super__Vector_impl_data._M_start)->type + lVar2) = 2;
          }
        }
        else if (pBVar1->tag == BTOR2_TAG_SORT_bitvec) {
          *(undefined4 *)
           ((long)&(current_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                    _M_impl.super__Vector_impl_data._M_start)->type + lVar2) = 1;
          *(undefined4 *)
           ((long)&(next_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                    _M_impl.super__Vector_impl_data._M_start)->type + lVar2) = 1;
          if (dump_vcd == '\x01') {
            *(undefined4 *)
             ((long)&((vcd_writer->prev_value).
                      super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
                      super__Vector_impl_data._M_start)->type + lVar2) = 1;
          }
        }
        else {
          die("Unknown sort");
        }
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar3 < num_format_lines);
  }
  return;
}

Assistant:

void
setup_states ()
{
  current_state.resize (num_format_lines);
  next_state.resize (num_format_lines);
  if (dump_vcd) vcd_writer->prev_value.resize (num_format_lines);

  for (int i = 0; i < num_format_lines; i++)
  {
    Btor2Line *l = btor2parser_get_line_by_id (model, i);
    if (l)
    {
      Btor2Sort *sort = get_sort (l, model);
      switch (sort->tag)
      {
        case BTOR2_TAG_SORT_bitvec:
          current_state[i].type = BtorSimState::Type::BITVEC;
          next_state[i].type    = BtorSimState::Type::BITVEC;
          if (dump_vcd)
          {
            vcd_writer->prev_value[i].type = BtorSimState::Type::BITVEC;
          }
          break;
        case BTOR2_TAG_SORT_array:
          current_state[i].type = BtorSimState::Type::ARRAY;
          next_state[i].type    = BtorSimState::Type::ARRAY;
          if (dump_vcd)
          {
            vcd_writer->prev_value[i].type = BtorSimState::Type::ARRAY;
          }
          break;
        default: die ("Unknown sort");
      }
    }
  }

  for (auto state : states)
  {
    assert (current_state[state->id].type != BtorSimState::Type::INVALID);
    assert (next_state[state->id].type != BtorSimState::Type::INVALID);
  }
}